

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbefec.cpp
# Opt level: O3

int DSDcc::HammingMBE::mbe_hamming1511(uchar *in,uchar *out)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  
  uVar3 = 0;
  lVar2 = 0xf;
  do {
    uVar3 = (uint)in[lVar2 + -1] | uVar3 * 2;
    lVar2 = lVar2 + -1;
  } while (lVar2 != 0);
  lVar2 = 0;
  uVar1 = 0;
  do {
    uVar4 = (int)((&hammingGenerator)[lVar2] & uVar3) % 2;
    iVar5 = 0xe;
    uVar7 = (&hammingGenerator)[lVar2] & uVar3;
    do {
      uVar6 = (int)uVar7 >> 1;
      uVar4 = uVar4 ^ uVar6 - (uVar6 - ((int)uVar7 >> 0x1f) & 0xfffffffe);
      iVar5 = iVar5 + -1;
      uVar7 = uVar6;
    } while (iVar5 != 0);
    uVar1 = uVar1 * 2 | uVar4;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  if (0 < (int)uVar1) {
    uVar3 = uVar3 ^ *(uint *)(hammingMatrix + (ulong)uVar1 * 4);
  }
  lVar2 = 0xf;
  do {
    out[lVar2 + -1] = (byte)(uVar3 >> 0xe) & 1;
    uVar3 = uVar3 * 2;
    lVar2 = lVar2 + -1;
  } while (lVar2 != 0);
  return (uint)(0 < (int)uVar1);
}

Assistant:

int HammingMBE::mbe_hamming1511(unsigned char *in, unsigned char *out)
{
    int i, j, errs, block, syndrome, stmp, stmp2;

    errs = 0;
    block = 0;

    for (i = 14; i >= 0; i--)
    {
        block <<= 1;
        block |= in[i];
    }

    syndrome = 0;

    for (i = 0; i < 4; i++)
    {
        syndrome <<= 1;
        stmp = block;
        stmp &= hammingGenerator[i];
        stmp2 = (stmp % 2);

        for (j = 0; j < 14; j++)
        {
            stmp >>= 1;
            stmp2 ^= (stmp % 2);
        }

        syndrome |= stmp2;
    }

    if (syndrome > 0)
    {
        errs++;
        block ^= hammingMatrix[syndrome];
    }

    for (i = 14; i >= 0; i--)
    {
        out[i] = (block & 0x4000) >> 14;
        block = block << 1;
    }

    return errs;
}